

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LiteralSelector.cpp
# Opt level: O0

void Kernel::LiteralSelector::ensureSomeColoredSelected(Clause *c,uint eligible)

{
  Color CVar1;
  uint n;
  Literal **ppLVar2;
  Clause *this;
  uint in_ESI;
  Clause *in_RDI;
  uint i_1;
  uint i;
  uint selCnt;
  uint in_stack_ffffffffffffffdc;
  Clause *in_stack_ffffffffffffffe0;
  uint local_18;
  uint local_14;
  
  CVar1 = Clause::color(in_stack_ffffffffffffffe0);
  if (CVar1 != COLOR_TRANSPARENT) {
    n = Clause::numSelected(in_RDI);
    for (local_14 = 0; local_18 = n, local_14 < n; local_14 = local_14 + 1) {
      ppLVar2 = Clause::operator[](in_RDI,local_14);
      CVar1 = Term::color(&(*ppLVar2)->super_Term);
      if (CVar1 != COLOR_TRANSPARENT) {
        return;
      }
    }
    for (; local_18 < in_ESI; local_18 = local_18 + 1) {
      ppLVar2 = Clause::operator[](in_RDI,local_18);
      CVar1 = Term::color(&(*ppLVar2)->super_Term);
      if (CVar1 != COLOR_TRANSPARENT) {
        this = (Clause *)Clause::operator[](in_RDI,n);
        ppLVar2 = Clause::operator[](in_RDI,local_18);
        std::swap<Kernel::Literal*>((Literal **)this,ppLVar2);
        Clause::setSelected(this,in_stack_ffffffffffffffdc);
        return;
      }
    }
  }
  return;
}

Assistant:

void LiteralSelector::ensureSomeColoredSelected(Clause* c, unsigned eligible)
{
  if(c->color()==COLOR_TRANSPARENT) {
    //if no literal is colored, do nothing
    return;
  }

  unsigned selCnt=c->numSelected();

  for(unsigned i=0;i<selCnt;i++) {
    if((*c)[i]->color()!=COLOR_TRANSPARENT) {
      return;
    }
  }

  for(unsigned i=selCnt;i<eligible;i++) {
    if((*c)[i]->color()!=COLOR_TRANSPARENT) {
      swap((*c)[selCnt], (*c)[i]);
      c->setSelected(selCnt+1);
      return;
    }
  }

  ASS(eligible < c->length() || //the colored literals are not among the eligible ones ...
      c->splits());             // .. unless the color comes from the propositional part
}